

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O3

int fits_hcompress64(LONGLONG *a,int ny,int nx,int scale,char *output,long *nbytes,int *status)

{
  double dVar1;
  LONGLONG *pLVar2;
  void *pvVar3;
  long lVar4;
  sbyte sVar5;
  int iVar6;
  undefined4 in_register_0000000c;
  long lVar7;
  long lVar8;
  char cVar9;
  uint uVar10;
  undefined4 in_register_00000014;
  long lVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  undefined4 in_register_00000034;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  char *pcVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  LONGLONG *pLVar24;
  int ny2;
  int iVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  int iVar29;
  uint uVar30;
  long lVar31;
  bool bVar32;
  LONGLONG vmax [3];
  undefined2 local_103;
  byte local_101;
  int local_100;
  uint local_fc;
  uint local_f8;
  int local_f4;
  LONGLONG *local_f0;
  long local_e8;
  void *local_e0;
  uint local_d8;
  int local_d4;
  ulong local_d0;
  long local_c8;
  undefined4 local_bc;
  ulong local_b8 [4];
  ulong local_98;
  char *local_90;
  long *local_88;
  ulong local_80;
  int local_78;
  int local_74;
  long local_70;
  LONGLONG *local_68;
  ulong local_60;
  LONGLONG *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  local_d0 = CONCAT44(in_register_00000034,ny);
  local_98 = CONCAT44(in_register_00000014,nx);
  local_80 = CONCAT44(in_register_0000000c,scale);
  if (0 < *status) {
    return *status;
  }
  if (ny < nx) {
    ny = nx;
  }
  local_90 = output;
  local_88 = nbytes;
  dVar1 = log((double)ny);
  iVar25 = (int)(dVar1 / 0.6931471805599453 + 0.5);
  pLVar2 = (LONGLONG *)malloc((long)((ny - (ny + 1 >> 0x1f)) + 1 >> 1) << 3);
  if (pLVar2 == (LONGLONG *)0x0) {
    ffpmsg("htrans64: insufficient memory");
    iVar25 = 0x19d;
    goto LAB_001c4078;
  }
  iVar25 = (uint)(1 << ((byte)iVar25 & 0x1f) < ny) + iVar25;
  uVar12 = local_d0;
  local_f0 = a;
  if (0 < iVar25) {
    local_48 = (ulong)(uint)((int)local_d0 * 2);
    local_60 = local_d0 & 0xffffffff;
    local_68 = a + 1;
    local_70 = (long)(int)local_d0 << 3;
    lVar7 = 2;
    lVar21 = 1;
    local_e0 = (void *)0xfffffffffffffffe;
    pvVar3 = (void *)0xfffffffffffffffc;
    local_e8 = 1;
    local_f8 = 0;
    uVar27 = local_98 & 0xffffffff;
    uVar28 = local_d0 & 0xffffffff;
    iVar14 = 0;
    local_78 = iVar25;
    local_58 = pLVar2;
    do {
      lVar4 = local_70;
      local_d8 = (uint)uVar27;
      local_bc = (int)(uVar27 >> 0x1f) + local_d8 & 0xfffffffe;
      uVar10 = (uint)uVar28;
      local_f4 = uVar10 - ((int)(uVar28 >> 0x1f) + uVar10 & 0xfffffffe);
      iVar13 = 0;
      iVar25 = (int)local_d0;
      if (0 < (int)local_bc) {
        local_100 = uVar10 - local_f4;
        local_50 = (ulong)(local_f8 ^ 1);
        lVar26 = 0;
        iVar13 = 0;
        uVar12 = local_60;
        do {
          if (local_100 < 1) {
            iVar29 = iVar13 * iVar25;
            iVar6 = iVar25 + iVar29;
          }
          else {
            iVar6 = (int)uVar12;
            iVar15 = (int)lVar26;
            lVar31 = 0;
            do {
              lVar8 = local_68[iVar6 + lVar31] + local_68[(long)iVar6 + lVar31 + -1];
              lVar17 = local_68[(long)iVar15 + lVar31 + -1];
              lVar18 = local_68[iVar15 + lVar31];
              lVar23 = lVar18 + lVar17 + lVar8 >> (byte)local_f8;
              lVar16 = lVar8 - (lVar18 + lVar17) >> (byte)local_f8;
              lVar22 = local_68[iVar6 + lVar31] - local_68[(long)iVar6 + lVar31 + -1];
              lVar11 = (lVar22 + lVar18) - lVar17 >> (byte)local_f8;
              lVar8 = local_e8;
              if (lVar16 < 0) {
                lVar8 = 0;
              }
              local_68[iVar6 + lVar31] = (lVar22 - lVar18) + lVar17 >> (byte)local_f8;
              local_68[(long)iVar6 + lVar31 + -1] = lVar8 + lVar16 & (ulong)local_e0;
              lVar8 = local_e8;
              if (lVar11 < 0) {
                lVar8 = 0;
              }
              local_68[iVar15 + lVar31] = lVar8 + lVar11 & (ulong)local_e0;
              lVar8 = lVar7;
              if (lVar23 < 0) {
                lVar8 = lVar21;
              }
              local_68[(long)iVar15 + lVar31 + -1] = lVar8 + lVar23 & (ulong)pvVar3;
              lVar31 = lVar31 + 2;
              iVar29 = (int)lVar31;
            } while (iVar29 < local_100);
            iVar6 = iVar29 + iVar6;
            iVar29 = iVar29 + iVar15;
            pLVar2 = local_58;
            local_d4 = iVar13;
            local_40 = uVar12;
            local_38 = lVar26;
          }
          if (local_f4 != 0) {
            sVar5 = (sbyte)(local_f8 ^ 1);
            lVar8 = local_f0[iVar29] + local_f0[iVar6] << sVar5;
            lVar17 = local_f0[iVar6] - local_f0[iVar29] << sVar5;
            lVar31 = local_e8;
            if (lVar17 < 0) {
              lVar31 = 0;
            }
            lVar18 = lVar7;
            if (lVar8 < 0) {
              lVar18 = lVar21;
            }
            local_f0[iVar6] = lVar31 + lVar17 & (ulong)local_e0;
            local_f0[iVar29] = lVar18 + lVar8 & (ulong)pvVar3;
          }
          iVar13 = iVar13 + 2;
          lVar26 = lVar26 + local_48;
          uVar12 = uVar12 + local_48;
        } while (iVar13 < (int)local_bc);
      }
      if (local_d8 != local_bc) {
        iVar13 = iVar13 * iVar25;
        iVar25 = iVar13;
        if (local_f4 < (int)uVar10) {
          lVar26 = 0;
          do {
            lVar8 = local_68[(long)iVar13 + lVar26 + -1] + local_68[iVar13 + lVar26] <<
                    ((byte)local_f8 ^ 1);
            lVar17 = local_68[iVar13 + lVar26] - local_68[(long)iVar13 + lVar26 + -1] <<
                     ((byte)local_f8 ^ 1);
            lVar31 = local_e8;
            if (lVar17 < 0) {
              lVar31 = 0;
            }
            local_68[iVar13 + lVar26] = lVar31 + lVar17 & (ulong)local_e0;
            lVar31 = lVar7;
            if (lVar8 < 0) {
              lVar31 = lVar21;
            }
            local_68[(long)iVar13 + lVar26 + -1] = lVar31 + lVar8 & (ulong)pvVar3;
            lVar26 = lVar26 + 2;
          } while ((int)lVar26 < (int)(uVar10 - local_f4));
          iVar25 = iVar13 + (int)lVar26;
          local_d4 = iVar13;
        }
        if (local_f4 != 0) {
          lVar31 = local_f0[iVar25] << (2 - (byte)local_f8 & 0x3f);
          lVar26 = lVar21;
          if (-1 < lVar31) {
            lVar26 = lVar7;
          }
          local_f0[iVar25] = lVar26 + lVar31 & (ulong)pvVar3;
        }
      }
      pLVar24 = local_f0;
      local_fc = uVar10;
      local_e8 = lVar7;
      local_e0 = pvVar3;
      local_c8 = lVar21;
      local_74 = iVar14;
      if (0 < (int)local_d8) {
        do {
          shuffle64(pLVar24,uVar10,1,pLVar2);
          uVar27 = uVar27 - 1;
          pLVar24 = (LONGLONG *)((long)pLVar24 + lVar4);
        } while (uVar27 != 0);
      }
      uVar12 = local_d0;
      uVar30 = local_d8;
      if (0 < (int)uVar10) {
        uVar28 = (ulong)local_fc;
        pLVar24 = local_f0;
        do {
          shuffle64(pLVar24,uVar30,(int)uVar12,pLVar2);
          pLVar24 = pLVar24 + 1;
          uVar28 = uVar28 - 1;
        } while (uVar28 != 0);
      }
      uVar27 = (ulong)(uint)((int)(uVar30 + 1) >> 1);
      uVar28 = (ulong)(uint)((int)(local_fc + 1) >> 1);
      pvVar3 = (void *)((long)local_e0 * 2);
      lVar7 = local_e8 * 2;
      lVar21 = local_e8 * 2 + -1;
      iVar14 = local_74 + 1;
      local_f8 = 1;
    } while (iVar14 != local_78);
  }
  pLVar24 = local_f0;
  free(pLVar2);
  iVar14 = (int)uVar12;
  iVar25 = (int)local_98;
  if ((1 < (int)local_80) && (pLVar24 <= pLVar24 + (long)(iVar25 * iVar14) + -1)) {
    uVar28 = (ulong)(((int)local_80 + 1U >> 1) - 1);
    pLVar2 = pLVar24;
    do {
      uVar27 = -uVar28;
      if (0 < *pLVar2) {
        uVar27 = uVar28;
      }
      *pLVar2 = (long)(uVar27 + *pLVar2) / (long)(local_80 & 0xffffffff);
      pLVar2 = pLVar2 + 1;
    } while (pLVar2 <= pLVar24 + (long)(iVar25 * iVar14) + -1);
  }
  uVar10 = iVar25 * iVar14;
  lVar21 = *local_88;
  lVar7 = 0;
  noutmax = lVar21;
  *local_88 = 0;
  noutchar = 0;
  if (1 < lVar21) {
    local_90[0] = -0x23;
    local_90[1] = -0x67;
    noutchar = 2;
    lVar7 = 2;
  }
  lVar4 = 4;
  uVar28 = local_98 & 0xffffffff;
  do {
    *(char *)((long)local_b8 + lVar4 + -1) = (char)uVar28;
    uVar28 = (ulong)(uint)((int)uVar28 >> 8);
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  lVar4 = 0;
  do {
    if (lVar7 < lVar21) {
      local_90[lVar7] = *(char *)((long)local_b8 + lVar4);
      lVar7 = lVar7 + 1;
      noutchar = lVar7;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  lVar4 = 4;
  uVar12 = uVar12 & 0xffffffff;
  do {
    *(char *)((long)local_b8 + lVar4 + -1) = (char)uVar12;
    uVar12 = (ulong)(uint)((int)uVar12 >> 8);
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  lVar4 = 0;
  do {
    if (lVar7 < lVar21) {
      local_90[lVar7] = *(char *)((long)local_b8 + lVar4);
      lVar7 = lVar7 + 1;
      noutchar = lVar7;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  lVar4 = 4;
  uVar12 = local_80;
  do {
    *(char *)((long)local_b8 + lVar4 + -1) = (char)uVar12;
    uVar12 = (ulong)(uint)((int)uVar12 >> 8);
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  lVar4 = 0;
  do {
    if (lVar7 < lVar21) {
      local_90[lVar7] = *(char *)((long)local_b8 + lVar4);
      lVar7 = lVar7 + 1;
      noutchar = lVar7;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  lVar4 = *pLVar24;
  lVar26 = 8;
  do {
    *(char *)((long)local_b8 + lVar26 + -1) = (char)lVar4;
    lVar4 = lVar4 >> 8;
    lVar26 = lVar26 + -1;
  } while (lVar26 != 0);
  lVar4 = 0;
  do {
    if (lVar7 < lVar21) {
      local_90[lVar7] = *(char *)((long)local_b8 + lVar4);
      lVar7 = lVar7 + 1;
      noutchar = lVar7;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 8);
  *pLVar24 = 0;
  iVar13 = uVar10 + 0xe;
  if (-1 < (int)(uVar10 + 7)) {
    iVar13 = uVar10 + 7;
  }
  pvVar3 = calloc(1,(long)(iVar13 >> 3));
  pcVar19 = local_90;
  uVar12 = local_d0;
  if (pvVar3 == (void *)0x0) {
    pcVar19 = "encode64: insufficient memory";
  }
  else {
    iVar13 = (int)local_d0;
    if ((int)uVar10 < 1) {
      local_b8[0] = 0;
      local_b8[1] = 0;
      local_b8[2] = 0;
      iVar6 = (iVar25 - (iVar25 + 1 >> 0x1f)) + 1 >> 1;
      iVar14 = (iVar14 - (iVar14 + 1 >> 0x1f)) + 1 >> 1;
      uVar30 = 0;
    }
    else {
      uVar28 = 0;
      iVar14 = 8;
      uVar27 = 0;
      do {
        lVar4 = pLVar24[uVar28];
        uVar27 = uVar27 & 0xffffffff;
        if (lVar4 < 1) {
          if (lVar4 < 0) {
            *(char *)((long)pvVar3 + uVar27) = *(char *)((long)pvVar3 + uVar27) * '\x02' + '\x01';
            iVar14 = iVar14 + -1;
            pLVar24[uVar28] = -lVar4;
          }
        }
        else {
          *(char *)((long)pvVar3 + uVar27) = *(char *)((long)pvVar3 + uVar27) << 1;
          iVar14 = iVar14 + -1;
        }
        bVar32 = iVar14 == 0;
        if (bVar32) {
          iVar14 = 8;
        }
        uVar27 = bVar32 + uVar27;
        uVar28 = uVar28 + 1;
      } while (uVar10 != uVar28);
      if (iVar14 != 8) {
        *(char *)((long)pvVar3 + uVar27) = *(char *)((long)pvVar3 + uVar27) << ((byte)iVar14 & 0x1f)
        ;
        uVar27 = (ulong)((int)uVar27 + 1);
      }
      uVar30 = (uint)uVar27;
      local_b8[0] = 0;
      local_b8[1] = 0;
      local_b8[2] = 0;
      iVar6 = (iVar25 - (iVar25 + 1 >> 0x1f)) + 1 >> 1;
      iVar14 = (iVar13 - (iVar13 + 1 >> 0x1f)) + 1 >> 1;
      uVar28 = 0;
      iVar29 = 0;
      iVar25 = 0;
      do {
        uVar20 = (uint)(iVar14 <= iVar25) + (uint)(iVar6 <= iVar29);
        uVar27 = pLVar24[uVar28];
        if (pLVar24[uVar28] < (long)local_b8[uVar20]) {
          uVar27 = local_b8[uVar20];
        }
        local_b8[uVar20] = uVar27;
        iVar15 = iVar25 + 1;
        iVar25 = iVar15;
        if (iVar13 <= iVar15) {
          iVar25 = 0;
        }
        iVar29 = iVar29 + (uint)(iVar13 <= iVar15);
        uVar28 = uVar28 + 1;
      } while (uVar10 != uVar28);
    }
    lVar4 = 0;
    do {
      uVar28 = local_b8[lVar4];
      cVar9 = '\0';
      uVar27 = uVar28;
      if (0 < (long)uVar28) {
        do {
          uVar28 = uVar27 >> 1;
          cVar9 = cVar9 + '\x01';
          bVar32 = 1 < uVar27;
          uVar27 = uVar28;
        } while (bVar32);
      }
      *(char *)((long)&local_103 + lVar4) = cVar9;
      local_b8[lVar4] = uVar28;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    local_e0 = pvVar3;
    if (lVar21 < lVar7 + 3) {
LAB_001c4053:
      *local_88 = lVar7;
      pcVar19 = "encode: output buffer too small";
    }
    else {
      local_90[lVar7 + 2] = local_101;
      *(undefined2 *)(local_90 + lVar7) = local_103;
      buffer2 = 0;
      bits_to_go2 = 8;
      bitcount = 0;
      noutchar = lVar7 + 3;
      iVar25 = qtree_encode64(local_90,pLVar24,iVar13,iVar6,iVar14,(uint)(byte)local_103);
      if (iVar25 == 0) {
        iVar29 = (int)(((uint)(uVar12 >> 0x1f) & 1) + iVar13) >> 1;
        local_e8 = CONCAT44(local_e8._4_4_,(uint)local_103._1_1_);
        local_100 = iVar6;
        iVar25 = qtree_encode64(pcVar19,local_f0 + iVar14,iVar13,iVar6,iVar29,(uint)local_103._1_1_)
        ;
        if (iVar25 == 0) {
          local_c8 = CONCAT44(local_c8._4_4_,iVar29);
          iVar6 = local_100 * iVar13;
          local_100 = (int)(((uint)(local_98 >> 0x1f) & 1) + (int)local_98) >> 1;
          iVar25 = qtree_encode64(pcVar19,local_f0 + iVar6,iVar13,local_100,iVar14,(int)local_e8);
          if (iVar25 == 0) {
            iVar25 = qtree_encode64(pcVar19,local_f0 + (iVar6 + iVar14),iVar13,local_100,
                                    (int)local_c8,(uint)local_101);
          }
        }
      }
      output_nybble(pcVar19,0);
      pvVar3 = local_e0;
      lVar7 = noutchar;
      lVar21 = noutmax;
      lVar4 = (long)bits_to_go2;
      if (lVar4 < 8) {
        pcVar19[noutchar] = (char)(buffer2 << ((byte)bits_to_go2 & 0x1f));
        if (lVar7 < lVar21) {
          lVar7 = lVar7 + 1;
          noutchar = lVar7;
        }
        bitcount = bitcount + lVar4;
      }
      if (0 < (int)uVar30) {
        lVar4 = lVar7 + (ulong)uVar30;
        if (lVar21 < lVar4) {
          free(local_e0);
          goto LAB_001c4053;
        }
        memcpy(local_90 + lVar7,local_e0,(ulong)uVar30);
        lVar7 = lVar4;
        noutchar = lVar4;
      }
      free(pvVar3);
      *local_88 = lVar7;
      if (lVar7 < lVar21) goto LAB_001c4078;
      pcVar19 = "encode64: output buffer too small";
    }
  }
  ffpmsg(pcVar19);
  iVar25 = 0x19d;
LAB_001c4078:
  *status = iVar25;
  return iVar25;
}

Assistant:

int fits_hcompress64(LONGLONG *a, int ny, int nx, int scale, char *output, 
                  long *nbytes, int *status)
{
  /* 
     compress the input image using the H-compress algorithm
  
   a  - input image array
   nx - size of X axis of image
   ny - size of Y axis of image
   scale - quantization scale factor. Larger values results in more (lossy) compression
           scale = 0 does lossless compression
   output - pre-allocated array to hold the output compressed stream of bytes
   nbyts  - size of the compressed byte stream, in bytes

 NOTE: the nx and ny dimensions as defined within this code are reversed from
 the usual FITS notation.  ny is the fastest varying dimension, which is
 usually considered the X axis in the FITS image display

  */

  int stat;
  
  if (*status > 0) return(*status);

  /* H-transform */
  stat = htrans64(a, nx, ny);
  if (stat) {
     *status = stat;
     return(*status);
  }

  /* digitize */
  digitize64(a, nx, ny, scale);

  /* encode and write to output array */

  FFLOCK;
  noutmax = *nbytes;  /* input value is the allocated size of the array */
  *nbytes = 0;  /* reset */

  stat = encode64(output, nbytes, a, nx, ny, scale);
  FFUNLOCK;

  *status = stat;
  return(*status);
}